

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_rsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong elen;
  RSA *rsactx;
  RSA *local_30;
  
  if ((RSA *)*abstract != (RSA *)0x0) {
    RSA_free((RSA *)*abstract);
    *abstract = (void *)0x0;
  }
  uVar1 = _libssh2_ntohu32(hostkey_data);
  iVar3 = -1;
  if (uVar1 == 7) {
    iVar2 = strncmp((char *)(hostkey_data + 4),"ssh-rsa",7);
    if (iVar2 == 0) {
      uVar1 = _libssh2_ntohu32(hostkey_data + 0xb);
      elen = (ulong)uVar1;
      uVar1 = _libssh2_ntohu32(hostkey_data + elen + 0xf);
      iVar2 = _libssh2_rsa_new(&local_30,hostkey_data + 0xf,elen,hostkey_data + elen + 0x13,
                               (ulong)uVar1,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                               (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0);
      if (iVar2 == 0) {
        *abstract = local_30;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
hostkey_method_ssh_rsa_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    const unsigned char *s, *e, *n;
    unsigned long len, e_len, n_len;
    int ret;

    (void) hostkey_data_len;

    if (*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    s = hostkey_data;
    len = _libssh2_ntohu32(s);
    s += 4;

    if (len != 7 || strncmp((char *) s, "ssh-rsa", 7) != 0) {
        return -1;
    }
    s += 7;

    e_len = _libssh2_ntohu32(s);
    s += 4;

    e = s;
    s += e_len;
    n_len = _libssh2_ntohu32(s);
    s += 4;
    n = s;

    ret = _libssh2_rsa_new(&rsactx, e, e_len, n, n_len, NULL, 0,
                           NULL, 0, NULL, 0, NULL, 0, NULL, 0, NULL, 0);
    if (ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}